

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualpage.cpp
# Opt level: O0

void __thiscall sai::VirtualPage::DecryptTable(VirtualPage *this,uint32_t PageIndex)

{
  value_type_conflict2 vVar1;
  value_type_conflict2 vVar2;
  value_type_conflict2 vVar3;
  uint uVar4;
  _If_is_unsigned_integer<unsigned_int> _Var5;
  iterator pvVar6;
  const_reference pvVar7;
  uint32_t X;
  uint32_t *CurData;
  iterator __end1;
  iterator __begin1;
  array<unsigned_int,_1024UL> *__range1;
  uint32_t PrevData;
  uint32_t PageIndex_local;
  VirtualPage *this_local;
  
  __range1._0_4_ = PageIndex & 0xfffffe00;
  __end1 = std::array<unsigned_int,_1024UL>::begin((array<unsigned_int,_1024UL> *)this);
  pvVar6 = std::array<unsigned_int,_1024UL>::end((array<unsigned_int,_1024UL> *)this);
  for (; __end1 != pvVar6; __end1 = __end1 + 1) {
    uVar4 = (value_type_conflict2)__range1 ^ *__end1;
    pvVar7 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,
                        (ulong)((value_type_conflict2)__range1 >> 0x18));
    vVar1 = *pvVar7;
    pvVar7 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,
                        (ulong)((value_type_conflict2)__range1 >> 0x10 & 0xff));
    vVar2 = *pvVar7;
    pvVar7 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,
                        (ulong)((value_type_conflict2)__range1 >> 8 & 0xff));
    vVar3 = *pvVar7;
    pvVar7 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,
                        (ulong)((value_type_conflict2)__range1 & 0xff));
    __range1._0_4_ = *__end1;
    _Var5 = std::rotl<unsigned_int>(vVar1 + vVar2 + vVar3 + *pvVar7 ^ uVar4,0x10);
    *__end1 = _Var5;
  }
  return;
}

Assistant:

void VirtualPage::DecryptTable(std::uint32_t PageIndex)
{
	std::uint32_t PrevData = PageIndex & (~0x1FF);
#if defined(__AVX2__)
	__m256i PrevData8 = _mm256_set1_epi32(PrevData);
	for( std::size_t i = 0; i < (PageSize / sizeof(std::uint32_t)); i += 8 )
	{
		const __m256i CurData8 = _mm256_loadu_si256((__m256i*)(u32 + i));
		// There is no true _mm_alignr_epi8 for AVX2
		// An extra _mm256_permute2x128_si256 is needed
		PrevData8 = _mm256_alignr_epi8(
			CurData8, _mm256_permute2x128_si256(PrevData8, CurData8, _MM_SHUFFLE(0, 2, 0, 1)),
			sizeof(std::uint32_t) * 3
		);
		__m256i CurPlain8 = _mm256_xor_si256(
			_mm256_xor_si256(CurData8, PrevData8), KeySum8(PrevData8, Keys::User)
		);
		CurPlain8 = _mm256_shuffle_epi8(
			CurPlain8, _mm256_set_epi8(
						   13, 12, 15, 14, 9, 8, 11, 10, 5, 4, 7, 6, 1, 0, 3, 2, 13, 12, 15, 14, 9,
						   8, 11, 10, 5, 4, 7, 6, 1, 0, 3, 2
					   )
		);
		_mm256_storeu_si256((__m256i*)(u32 + i), CurPlain8);
		PrevData8 = CurData8;
	};
#else
	for( std::uint32_t& CurData : u32 )
	{
		std::uint32_t X = PrevData ^ CurData;
		X ^= Keys::User[(PrevData >> 24) & 0xFF] + Keys::User[(PrevData >> 16) & 0xFF]
		   + Keys::User[(PrevData >> 8) & 0xFF] + Keys::User[(PrevData >> 0) & 0xFF];
		PrevData = CurData;
		// CurData  = static_cast<std::uint32_t>((X << 16) | (X >> 16));
		CurData = std::rotl(X, 16);
	};
#endif
}